

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_Inventory(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  long *plVar1;
  PClass *pPVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  char *pcVar8;
  undefined8 *puVar9;
  bool bVar10;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      plVar1 = (long *)(param->field_0).field_1.a;
      if (plVar1 != (long *)0x0) {
        if (plVar1[1] == 0) {
          lVar5 = (**(code **)*plVar1)(plVar1);
          plVar1[1] = lVar5;
        }
        pPVar7 = (PClass *)plVar1[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar2 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar2) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042cc27;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          puVar9 = (undefined8 *)param[1].field_0.field_1.a;
          if (puVar9 == (undefined8 *)0x0) {
            NullParam("\"item\"");
            puVar9 = (undefined8 *)param[1].field_0.field_1.a;
          }
          pPVar2 = AInventory::RegistrationInfo.MyClass;
          if (puVar9 != (undefined8 *)0x0) {
            if (puVar9[1] == 0) {
              uVar6 = (**(code **)*puVar9)(puVar9);
              puVar9[1] = uVar6;
            }
            pPVar7 = (PClass *)puVar9[1];
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar2 && bVar10) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar10 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar2) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (!bVar10) {
              pcVar8 = "item == NULL || item->IsKindOf(RUNTIME_CLASS(AInventory))";
              goto LAB_0042cc46;
            }
          }
          uVar3 = (**(code **)(*plVar1 + 0xb8))(plVar1,puVar9);
          if (numret < 1) {
            iVar4 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x33a,
                            "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\0') {
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            *(uint *)ret->Location = uVar3 & 0xff;
            iVar4 = 1;
          }
          return iVar4;
        }
        pcVar8 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_0042cc46:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x339,
                    "int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0042cc27:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x338,"int AF_AActor_Inventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Inventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(item, AInventory);
	ACTION_RETURN_BOOL(self->UseInventory(item));
}